

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataTemplatedScatter<long>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *param_9,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  byte *pbVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  byte bVar8;
  const_reference pvVar9;
  idx_t iVar10;
  idx_t iVar11;
  
  pSVar2 = (source_format->unified).sel;
  pdVar3 = (source_format->unified).data;
  pdVar4 = row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if ((source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (append_count != 0) {
      iVar11 = 0;
      do {
        iVar10 = iVar11;
        if (append_sel->sel_vector != (sel_t *)0x0) {
          iVar10 = (idx_t)append_sel->sel_vector[iVar11];
        }
        psVar6 = pSVar2->sel_vector;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar10];
        }
        *(undefined8 *)(*(long *)(pdVar4 + iVar11 * 8) + vVar5) =
             *(undefined8 *)(pdVar3 + iVar10 * 8);
        iVar11 = iVar11 + 1;
      } while (append_count != iVar11);
    }
  }
  else if (append_count != 0) {
    bVar8 = (byte)col_idx & 7;
    iVar11 = 0;
    do {
      iVar10 = iVar11;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)append_sel->sel_vector[iVar11];
      }
      psVar6 = pSVar2->sel_vector;
      if (psVar6 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar6[iVar10];
      }
      puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)) {
        *(undefined8 *)(*(long *)(pdVar4 + iVar11 * 8) + vVar5) =
             *(undefined8 *)(pdVar3 + iVar10 * 8);
      }
      else {
        *(undefined8 *)(*(long *)(pdVar4 + iVar11 * 8) + vVar5) = 0x8000000000000000;
        pbVar1 = (byte *)(*(long *)(pdVar4 + iVar11 * 8) + (col_idx >> 3));
        *pbVar1 = *pbVar1 & (-2 << bVar8 | 0xfeU >> 8 - bVar8);
      }
      iVar11 = iVar11 + 1;
    } while (append_count != iVar11);
  }
  return;
}

Assistant:

static void TupleDataTemplatedScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                      const SelectionVector &append_sel, const idx_t append_count,
                                      const TupleDataLayout &layout, const Vector &row_locations,
                                      Vector &heap_locations, const idx_t col_idx, const UnifiedVectorFormat &,
                                      const vector<TupleDataScatterFunction> &) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	if (validity.AllValid()) {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
		}
	} else {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (validity.RowIsValid(source_idx)) {
				TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
			} else {
				TupleDataValueStore<T>(NullValue<T>(), target_locations[i], offset_in_row, target_heap_locations[i]);
				ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
			}
		}
	}
}